

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeLogger.h
# Opt level: O0

void __thiscall
TimeLogger<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~TimeLogger
          (TimeLogger<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  ostream *poVar1;
  rep rVar2;
  void *this_00;
  long in_RDI;
  time_point end;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff88;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 8),"Date: ");
  get_date_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Elapsed time: ");
  std::chrono::operator-(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffff78);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
  this_00 = (void *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

~TimeLogger() {

        auto end = std::chrono::system_clock::now();
        stream << "Date: " << get_date() << std::endl
               << "Elapsed time: " << ch::duration_cast<T>(end - start).count() << std::endl;
    }